

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<float> * __thiscall
cimg_library::CImg<float>::resize
          (CImg<float> *this,int size_x,int size_y,int size_z,int size_c,int interpolation_type,
          uint boundary_conditions,float centering_x,float centering_y,float centering_z,
          float centering_c)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  unsigned_long uVar5;
  float local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  float local_b4;
  uint local_ac;
  uint local_a4;
  uint local_9c;
  CImg<float> local_80;
  float local_5c;
  uint local_58;
  uint sc;
  uint sz;
  uint sy;
  uint sx;
  uint _sc;
  uint _sz;
  uint _sy;
  uint _sx;
  float centering_c_local;
  float centering_z_local;
  float centering_y_local;
  float centering_x_local;
  int interpolation_type_local;
  int size_c_local;
  int size_z_local;
  int size_y_local;
  int size_x_local;
  CImg<float> *this_local;
  
  _sy = (uint)centering_c;
  _sx = (uint)centering_z;
  centering_c_local = centering_y;
  centering_z_local = centering_x;
  centering_y_local = (float)interpolation_type;
  centering_x_local = (float)size_c;
  interpolation_type_local = size_z;
  size_c_local = size_y;
  size_z_local = size_x;
  _size_y_local = this;
  if ((((size_x == 0) || (size_y == 0)) || (size_z == 0)) || (size_c == 0)) {
    this_local = assign(this);
  }
  else {
    local_9c = size_x;
    if (size_x < 0) {
      iVar2 = width(this);
      local_9c = (-size_x * iVar2) / 100;
    }
    _sz = local_9c;
    if (size_c_local < 0) {
      iVar2 = -size_c_local;
      iVar3 = height(this);
      local_a4 = (iVar2 * iVar3) / 100;
    }
    else {
      local_a4 = size_c_local;
    }
    _sc = local_a4;
    if (interpolation_type_local < 0) {
      iVar2 = -interpolation_type_local;
      iVar3 = depth(this);
      local_ac = (iVar2 * iVar3) / 100;
    }
    else {
      local_ac = interpolation_type_local;
    }
    sx = local_ac;
    if ((int)centering_x_local < 0) {
      iVar2 = -(int)centering_x_local;
      iVar3 = spectrum(this);
      local_b4 = (float)((iVar2 * iVar3) / 100);
    }
    else {
      local_b4 = centering_x_local;
    }
    sy = (uint)local_b4;
    if (_sz == 0) {
      local_bc = 1;
    }
    else {
      local_bc = _sz;
    }
    sz = local_bc;
    if (_sc == 0) {
      local_c0 = 1;
    }
    else {
      local_c0 = _sc;
    }
    sc = local_c0;
    if (sx == 0) {
      local_c4 = 1;
    }
    else {
      local_c4 = sx;
    }
    local_58 = local_c4;
    if (local_b4 == 0.0) {
      local_c8 = 1.4013e-45;
    }
    else {
      local_c8 = local_b4;
    }
    local_5c = local_c8;
    this_local = this;
    if (((local_bc != this->_width) || (local_c0 != this->_height)) ||
       ((local_c4 != this->_depth || (local_c8 != (float)this->_spectrum)))) {
      bVar1 = is_empty(this);
      if (bVar1) {
        this_local = assign(this,sz,sc,local_58,(uint)local_5c,0.0);
      }
      else if ((centering_y_local == -NAN) &&
              (uVar4 = sz * sc * local_58 * (int)local_5c, uVar5 = size(this), uVar4 == uVar5)) {
        this->_width = sz;
        this->_height = sc;
        this->_depth = local_58;
        this->_spectrum = (uint)local_5c;
      }
      else {
        get_resize(&local_80,this,sz,sc,local_58,(int)local_5c,(int)centering_y_local,
                   boundary_conditions,centering_z_local,centering_c_local,(float)_sx,(float)_sy);
        this_local = move_to(&local_80,this);
        ~CImg(&local_80);
      }
    }
  }
  return this_local;
}

Assistant:

CImg<T>& resize(const int size_x, const int size_y=-100,
                    const int size_z=-100, const int size_c=-100,
                    const int interpolation_type=1, const unsigned int boundary_conditions=0,
                    const float centering_x = 0, const float centering_y = 0,
                    const float centering_z = 0, const float centering_c = 0) {
      if (!size_x || !size_y || !size_z || !size_c) return assign();
      const unsigned int
        _sx = (unsigned int)(size_x<0?-size_x*width()/100:size_x),
        _sy = (unsigned int)(size_y<0?-size_y*height()/100:size_y),
        _sz = (unsigned int)(size_z<0?-size_z*depth()/100:size_z),
        _sc = (unsigned int)(size_c<0?-size_c*spectrum()/100:size_c),
        sx = _sx?_sx:1, sy = _sy?_sy:1, sz = _sz?_sz:1, sc = _sc?_sc:1;
      if (sx==_width && sy==_height && sz==_depth && sc==_spectrum) return *this;
      if (is_empty()) return assign(sx,sy,sz,sc,(T)0);
      if (interpolation_type==-1 && sx*sy*sz*sc==size()) {
	_width = sx; _height = sy; _depth = sz; _spectrum = sc;
	return *this;
      }
      return get_resize(sx,sy,sz,sc,interpolation_type,boundary_conditions,centering_x,centering_y,centering_z,centering_c).move_to(*this);
    }